

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1f7a::LexerTest_pathStrings_Test::TestBody(LexerTest_pathStrings_Test *this)

{
  StringRef buffer;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  AssertHelper local_350;
  Message local_348;
  Kind local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_17;
  Message local_320;
  Kind local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_16;
  Message local_2f8;
  int local_2f0 [2];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_15;
  Message local_2d0;
  Kind local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_14;
  Message local_2a8;
  Kind local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_13;
  Message local_280;
  int local_278 [2];
  undefined1 local_270 [8];
  AssertionResult gtest_ar_12;
  Message local_258;
  Kind local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_11;
  Message local_230;
  Kind local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_10;
  Message local_208;
  int local_200 [2];
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_9;
  Message local_1e0;
  Kind local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_8;
  Message local_1b8;
  Kind local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_7;
  Message local_190;
  int local_188 [2];
  undefined1 local_180 [8];
  AssertionResult gtest_ar_6;
  Message local_168;
  Kind local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_5;
  Message local_140;
  Kind local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  int local_110 [2];
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  Kind local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  int local_c0 [2];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0;
  Kind local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  Token tok;
  undefined1 local_58 [8];
  Lexer lexer;
  StringRef input;
  LexerTest_pathStrings_Test *this_local;
  
  lexer._32_8_ = anon_var_dwarf_3bb7;
  sVar2 = strlen("this is: a| path$ str$:ing$\ncontext\n#hash-is-ok\n=equal-is-too\n");
  tok.line = lexer.mode;
  tok.column = lexer._36_4_;
  buffer.Length = sVar2;
  buffer.Data = (char *)lexer._32_8_;
  llbuild::ninja::Lexer::Lexer((Lexer *)local_58,buffer);
  llbuild::ninja::Lexer::setMode((Lexer *)local_58,PathString);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_94 = String;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_90,"ninja::Token::Kind::String","tok.tokenKind",&local_94,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c0[1] = 0;
  local_c0[0] = memcmp((void *)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,"this",(ulong)tok.start._4_4_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b8,"0","memcmp(tok.start, \"this\", tok.length)",local_c0 + 1,
             local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_e4 = String;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_e0,"ninja::Token::Kind::String","tok.tokenKind",&local_e4,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_110[1] = 0;
  local_110[0] = memcmp((void *)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl,"is",(ulong)tok.start._4_4_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_108,"0","memcmp(tok.start, \"is\", tok.length)",local_110 + 1,
             local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_134 = Colon;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_130,"ninja::Token::Kind::Colon","tok.tokenKind",&local_134,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_15c = String;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_158,"ninja::Token::Kind::String","tok.tokenKind",&local_15c,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_188[1] = 0;
  local_188[0] = memcmp((void *)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl,"a",(ulong)tok.start._4_4_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_180,"0","memcmp(tok.start, \"a\", tok.length)",local_188 + 1,
             local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xed,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_1ac = Pipe;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_1a8,"ninja::Token::Kind::Pipe","tok.tokenKind",&local_1ac,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_1d4 = String;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_1d0,"ninja::Token::Kind::String","tok.tokenKind",&local_1d4,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xf3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_200[1] = 0;
  local_200[0] = memcmp((void *)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl,"path$ str$:ing$\ncontext",(ulong)tok.start._4_4_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1f8,"0",
             "memcmp(tok.start, \"path$ str$:ing$\\ncontext\", tok.length)",local_200 + 1,local_200)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xf4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_224 = Newline;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_220,"ninja::Token::Kind::Newline","tok.tokenKind",&local_224,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xf6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_24c = String;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_248,"ninja::Token::Kind::String","tok.tokenKind",&local_24c,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xfa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  local_278[1] = 0;
  local_278[0] = memcmp((void *)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl,"#hash-is-ok",(ulong)tok.start._4_4_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_270,"0","memcmp(tok.start, \"#hash-is-ok\", tok.length)",
             local_278 + 1,local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xfb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_29c = Newline;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_298,"ninja::Token::Kind::Newline","tok.tokenKind",&local_29c,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0xfd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_2c4 = String;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_2c0,"ninja::Token::Kind::String","tok.tokenKind",&local_2c4,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x100,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  local_2f0[1] = 0;
  local_2f0[0] = memcmp((void *)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl,"=equal-is-too",(ulong)tok.start._4_4_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2e8,"0","memcmp(tok.start, \"=equal-is-too\", tok.length)",
             local_2f0 + 1,local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x101,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_314 = Newline;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_310,"ninja::Token::Kind::Newline","tok.tokenKind",&local_314,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x103,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_33c = EndOfFile;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_338,"ninja::Token::Kind::EndOfFile","tok.tokenKind",&local_33c,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x107,pcVar3);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  llbuild::ninja::Lexer::~Lexer((Lexer *)local_58);
  return;
}

Assistant:

TEST(LexerTest, pathStrings) {
  StringRef input = "this is: a| path$ str$:ing$\ncontext\n\
#hash-is-ok\n\
=equal-is-too\n";
  ninja::Lexer lexer(input);
  ninja::Token tok;

  // Put the lexer into "path" string mode.
  lexer.setMode(ninja::Lexer::LexingMode::PathString);

  // Check we still split on spaces.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "this", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "is", tok.length));

  // Check that we recognized the other tokens.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Colon, tok.tokenKind);
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "a", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Pipe, tok.tokenKind);

  // Check that we honor escape sequences.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "path$ str$:ing$\ncontext", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Newline, tok.tokenKind);

  // Check that we allow '#' and '=' in path strings.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "#hash-is-ok", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Newline, tok.tokenKind);

  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "=equal-is-too", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Newline, tok.tokenKind);

  // Check final token.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::EndOfFile, tok.tokenKind);
}